

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_HealObj(FParser *this)

{
  int iVar1;
  AActor *pAVar2;
  undefined4 extraout_var;
  
  if (this->t_argc == 0) {
    pAVar2 = (this->Script->trigger).field_0.p;
    if ((pAVar2 != (AActor *)0x0) &&
       (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->Script->trigger).field_0.p = (AActor *)0x0;
      pAVar2 = (AActor *)0x0;
    }
  }
  else {
    pAVar2 = actorvalue(this->t_argv);
  }
  if (this->t_argc < 2) {
    if ((pAVar2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar1 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
      (pAVar2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
    }
    iVar1 = *(int *)(((pAVar2->super_DThinker).super_DObject.Class)->Defaults + 0x1fc);
  }
  else {
    if (this->t_argc != 2) {
      script_error("invalid number of arguments for objheal");
      return;
    }
    iVar1 = intvalue(this->t_argv + 1);
    iVar1 = iVar1 + pAVar2->health;
  }
  pAVar2->health = iVar1;
  if (pAVar2->player != (player_t *)0x0) {
    pAVar2->player->health = iVar1;
  }
  return;
}

Assistant:

void FParser::SF_HealObj()  //no pain sound
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	if(t_argc < 2)
	{
		mo->health = mo->GetDefault()->health;
		if(mo->player) mo->player->health = mo->health;
	}

	else if (t_argc == 2)
	{
		mo->health += intvalue(t_argv[1]);
		if(mo->player) mo->player->health = mo->health;
	}

	else
		script_error("invalid number of arguments for objheal");
}